

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

us_socket_t *
us_socket_context_connect
          (int ssl,us_socket_context_t *context,char *host,int port,char *source_host,int options,
          int socket_ext_size)

{
  int fd;
  undefined4 in_ECX;
  us_internal_ssl_socket_context_t *in_RDX;
  us_socket_context_t *in_RSI;
  int in_EDI;
  us_poll_t *in_R8;
  undefined4 in_R9D;
  us_socket_t *connect_socket;
  us_poll_t *p;
  int connect_socket_fd;
  undefined4 in_stack_00000038;
  undefined8 in_stack_ffffffffffffffb8;
  us_loop_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  us_internal_ssl_socket_t *local_8;
  
  if (in_EDI == 0) {
    fd = bsd_create_connect_socket((char *)CONCAT44(ssl,in_stack_00000038),context._4_4_,host,port);
    if (fd == -1) {
      local_8 = (us_internal_ssl_socket_t *)0x0;
    }
    else {
      local_8 = (us_internal_ssl_socket_t *)
                us_create_poll(in_stack_ffffffffffffffc0,
                               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                               (uint)in_stack_ffffffffffffffb8);
      us_poll_init((us_poll_t *)local_8,fd,2);
      us_poll_start(in_R8,(us_loop_t *)CONCAT44(in_R9D,fd),(int)((ulong)local_8 >> 0x20));
      (local_8->s).context = in_RSI;
      us_internal_socket_context_link(in_RSI,&local_8->s);
    }
  }
  else {
    local_8 = us_internal_ssl_socket_context_connect
                        (in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         (int)((ulong)in_R8 >> 0x20),
                         (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                         (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                         (int)in_stack_ffffffffffffffc0);
  }
  return &local_8->s;
}

Assistant:

struct us_socket_t *us_socket_context_connect(int ssl, struct us_socket_context_t *context, const char *host, int port, const char *source_host, int options, int socket_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_t *) us_internal_ssl_socket_context_connect((struct us_internal_ssl_socket_context_t *) context, host, port, source_host, options, socket_ext_size);
    }
#endif

    LIBUS_SOCKET_DESCRIPTOR connect_socket_fd = bsd_create_connect_socket(host, port, source_host, options);
    if (connect_socket_fd == LIBUS_SOCKET_ERROR) {
        return 0;
    }

    /* Connect sockets are semi-sockets just like listen sockets */
    struct us_poll_t *p = us_create_poll(context->loop, 0, sizeof(struct us_socket_t) + socket_ext_size);
    us_poll_init(p, connect_socket_fd, POLL_TYPE_SEMI_SOCKET);
    us_poll_start(p, context->loop, LIBUS_SOCKET_WRITABLE);

    struct us_socket_t *connect_socket = (struct us_socket_t *) p;

    /* Link it into context so that timeout fires properly */
    connect_socket->context = context;
    us_internal_socket_context_link(context, connect_socket);

    return connect_socket;
}